

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

ON_LengthValue * __thiscall
ON_LengthValue::ChangeLength
          (ON_LengthValue *__return_storage_ptr__,ON_LengthValue *this,double length_value)

{
  ON_wString *src;
  bool bVar1;
  ON_LengthValue local_48;
  
  ON_LengthValue(__return_storage_ptr__,this);
  bVar1 = ON_IsValid(length_value);
  if (bVar1) {
    Create(&local_48,length_value,&this->m_length_unit_system,this->m_context_locale_id,
           this->m_string_format);
    src = &local_48.m_length_unit_system.m_custom_unit_name;
    __return_storage_ptr__->m_context_angle_unit_system = local_48.m_context_angle_unit_system;
    __return_storage_ptr__->m_string_format = local_48.m_string_format;
    __return_storage_ptr__->m_context_locale_id = local_48.m_context_locale_id;
    (__return_storage_ptr__->m_length_unit_system).m_unit_system =
         local_48.m_length_unit_system.m_unit_system;
    *(undefined3 *)&(__return_storage_ptr__->m_length_unit_system).field_0x1 =
         local_48.m_length_unit_system._1_3_;
    (__return_storage_ptr__->m_length_unit_system).m_reserved =
         local_48.m_length_unit_system.m_reserved;
    (__return_storage_ptr__->m_length_unit_system).m_meters_per_custom_unit =
         local_48.m_length_unit_system.m_meters_per_custom_unit;
    ON_wString::operator=(&(__return_storage_ptr__->m_length_unit_system).m_custom_unit_name,src);
    __return_storage_ptr__->m_length = local_48.m_length;
    ON_wString::operator=(&__return_storage_ptr__->m_length_as_string,&local_48.m_length_as_string);
    ON_wString::~ON_wString(&local_48.m_length_as_string);
    ON_wString::~ON_wString(src);
  }
  else {
    ON_wString::operator=(&__return_storage_ptr__->m_length_as_string,&ON_wString::EmptyString);
    __return_storage_ptr__->m_length = Unset.m_length;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_LengthValue ON_LengthValue::ChangeLength(
  double length_value
) const
{
  ON_LengthValue rc(*this);
  if (!ON_IsValid(length_value))
  {
    rc.m_length_as_string = ON_wString::EmptyString;
    rc.m_length = ON_LengthValue::Unset.m_length;
  }
  else
  {
    rc = ON_LengthValue::Create(length_value, m_length_unit_system, m_context_locale_id, m_string_format);
  }
  return rc;
}